

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O1

matrix<unsigned_int,_521UL> *
trng::operator*(matrix<unsigned_int,_521UL> *__return_storage_ptr__,matrix<unsigned_int,_521UL> *a,
               matrix<unsigned_int,_521UL> *b)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  pointer puVar4;
  size_type j_end_1;
  pointer __s;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_type j0;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  pointer puVar12;
  pointer puVar13;
  size_type i;
  pointer puVar14;
  pointer puVar15;
  pointer puVar16;
  int iVar17;
  size_type j_end;
  value_type_conflict4 *__val;
  bool bVar18;
  pointer local_60;
  
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x109144);
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x42451;
  memset(__s,0,0x109144);
  lVar6 = 0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = __s + 0x42451;
  puVar2 = (a->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar15 = (b->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = 0;
  local_60 = __s;
  do {
    uVar5 = 0x1e9;
    if (uVar9 < 0x1e9) {
      uVar5 = uVar9;
    }
    lVar7 = -0x109144;
    do {
      if (uVar9 < uVar5 + 0x20) {
        memset((void *)((long)local_60 + (long)&__DT_RELA[0x2d9].r_info + lVar7 + 4),0,
               (uVar5 & 0xffffffff) * 4 + lVar6 * -0x80 + 0x80);
      }
      lVar7 = lVar7 + 0x824;
    } while (lVar7 != 0);
    uVar5 = 0x1e9;
    if (uVar9 < 0x1e9) {
      uVar5 = uVar9;
    }
    uVar10 = 0;
    puVar12 = puVar2;
    puVar16 = puVar15;
    do {
      uVar11 = 0x1e9;
      if (uVar10 < 0x1e9) {
        uVar11 = uVar10;
      }
      lVar7 = 0;
      uVar3 = uVar9;
      puVar4 = puVar16;
      puVar13 = puVar12;
      do {
        for (; uVar3 < uVar5 + 0x20; uVar3 = uVar3 + 1) {
          iVar17 = 0;
          if (uVar10 < uVar11 + 0x20) {
            lVar8 = 0;
            iVar17 = 0;
            puVar14 = puVar4;
            do {
              iVar17 = iVar17 + *puVar14 * *(pointer)((long)puVar13 + lVar8 * 4);
              lVar1 = uVar10 + lVar8;
              lVar8 = lVar8 + 1;
              puVar14 = puVar14 + 0x209;
            } while (lVar1 + 1U < uVar11 + 0x20);
          }
          __s[lVar7 * 0x209 + uVar3] = __s[lVar7 * 0x209 + uVar3] + iVar17;
          puVar4 = (pointer)((long)puVar4 + 4);
        }
        lVar7 = lVar7 + 1;
        puVar13 = (pointer)((long)puVar13 + 0x824);
        uVar3 = uVar9;
        puVar4 = puVar16;
      } while (lVar7 != 0x209);
      puVar12 = puVar12 + 0x20;
      puVar16 = puVar16 + 0x4120;
      bVar18 = uVar10 < 0x1e9;
      uVar10 = uVar10 + 0x20;
    } while (bVar18);
    uVar9 = uVar9 + 0x20;
    lVar6 = lVar6 + 1;
    local_60 = local_60 + 0x20;
    puVar15 = puVar15 + 0x20;
  } while (lVar6 != 0x11);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }